

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void ZSTD_buildFSETable(ZSTD_seqSymbol *dt,short *normalizedCounter,uint maxSymbolValue,
                       U32 *baseValue,U32 *nbAdditionalBits,uint tableLog)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  undefined4 uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  U16 symbolNext [53];
  ushort local_a8 [60];
  
  bVar2 = (byte)tableLog;
  uVar8 = 1 << (bVar2 & 0x1f);
  if (0x34 < maxSymbolValue) {
    __assert_fail("maxSymbolValue <= MaxSeq",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6236,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  if (9 < tableLog) {
    __assert_fail("tableLog <= MaxFSELog",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6237,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  uVar4 = maxSymbolValue + 1;
  uVar5 = 1;
  uVar11 = 0;
  uVar9 = (ulong)(uVar8 - 1);
  do {
    uVar12 = normalizedCounter[uVar11];
    if (uVar12 == 0xffff) {
      dt[uVar9 + 1].baseValue = (U32)uVar11;
      uVar12 = 1;
      uVar9 = (ulong)((int)uVar9 - 1);
    }
    else {
      if ((short)uVar12 < 0) {
        __assert_fail("normalizedCounter[s]>=0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6245,
                      "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                     );
      }
      if ((0x10000 << (bVar2 - 1 & 0x1f)) >> 0x10 <= (int)(uint)uVar12) {
        uVar5 = 0;
      }
    }
    local_a8[uVar11] = uVar12;
    uVar11 = uVar11 + 1;
  } while (uVar4 != uVar11);
  dt->nextState = (short)uVar5;
  dt->nbAdditionalBits = (char)((uint)uVar5 >> 0x10);
  dt->nbBits = (char)((uint)uVar5 >> 0x18);
  dt->baseValue = tableLog;
  uVar11 = 0;
  uVar6 = 0;
  do {
    sVar1 = normalizedCounter[uVar11];
    if (0 < sVar1) {
      iVar10 = 0;
      do {
        dt[(ulong)uVar6 + 1].baseValue = (U32)uVar11;
        do {
          uVar6 = uVar6 + (uVar8 >> 3) + (uVar8 >> 1) + 3 & uVar8 - 1;
        } while ((uint)uVar9 < uVar6);
        iVar10 = iVar10 + 1;
      } while (iVar10 != sVar1);
    }
    uVar11 = uVar11 + 1;
  } while (uVar11 != uVar4 + (uVar4 == 0));
  if (uVar6 != 0) {
    __assert_fail("position == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6256,
                  "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
                 );
  }
  lVar7 = 0;
  while( true ) {
    uVar4 = dt[lVar7 + 1].baseValue;
    uVar12 = local_a8[uVar4];
    local_a8[uVar4] = uVar12 + 1;
    if (uVar12 == 0) {
      __assert_fail("val != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x5a1,"unsigned int BIT_highbit32(U32)");
    }
    iVar10 = 0x1f;
    if (uVar12 != 0) {
      for (; uVar12 >> iVar10 == 0; iVar10 = iVar10 + -1) {
      }
    }
    bVar3 = bVar2 - (char)iVar10;
    dt[lVar7 + 1].nbBits = bVar3;
    dt[lVar7 + 1].nextState = (uVar12 << (bVar3 & 0x1f)) - (short)uVar8;
    if (0xfe < nbAdditionalBits[uVar4]) break;
    dt[lVar7 + 1].nbAdditionalBits = (BYTE)nbAdditionalBits[uVar4];
    dt[lVar7 + 1].baseValue = baseValue[uVar4];
    lVar7 = lVar7 + 1;
    if (uVar8 == (uint)lVar7) {
      return;
    }
  }
  __assert_fail("nbAdditionalBits[symbol] < 255",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x6260,
                "void ZSTD_buildFSETable(ZSTD_seqSymbol *, const short *, unsigned int, const U32 *, const U32 *, unsigned int)"
               );
}

Assistant:

void
ZSTD_buildFSETable(ZSTD_seqSymbol* dt,
            const short* normalizedCounter, unsigned maxSymbolValue,
            const U32* baseValue, const U32* nbAdditionalBits,
            unsigned tableLog)
{
    ZSTD_seqSymbol* const tableDecode = dt+1;
    U16 symbolNext[MaxSeq+1];

    U32 const maxSV1 = maxSymbolValue + 1;
    U32 const tableSize = 1 << tableLog;
    U32 highThreshold = tableSize-1;

    /* Sanity Checks */
    assert(maxSymbolValue <= MaxSeq);
    assert(tableLog <= MaxFSELog);

    /* Init, lay down lowprob symbols */
    {   ZSTD_seqSymbol_header DTableH;
        DTableH.tableLog = tableLog;
        DTableH.fastMode = 1;
        {   S16 const largeLimit= (S16)(1 << (tableLog-1));
            U32 s;
            for (s=0; s<maxSV1; s++) {
                if (normalizedCounter[s]==-1) {
                    tableDecode[highThreshold--].baseValue = s;
                    symbolNext[s] = 1;
                } else {
                    if (normalizedCounter[s] >= largeLimit) DTableH.fastMode=0;
                    assert(normalizedCounter[s]>=0);
                    symbolNext[s] = (U16)normalizedCounter[s];
        }   }   }
        memcpy(dt, &DTableH, sizeof(DTableH));
    }

    /* Spread symbols */
    {   U32 const tableMask = tableSize-1;
        U32 const step = FSE_TABLESTEP(tableSize);
        U32 s, position = 0;
        for (s=0; s<maxSV1; s++) {
            int i;
            for (i=0; i<normalizedCounter[s]; i++) {
                tableDecode[position].baseValue = s;
                position = (position + step) & tableMask;
                while (position > highThreshold) position = (position + step) & tableMask;   /* lowprob area */
        }   }
        assert(position == 0); /* position must reach all cells once, otherwise normalizedCounter is incorrect */
    }

    /* Build Decoding table */
    {   U32 u;
        for (u=0; u<tableSize; u++) {
            U32 const symbol = tableDecode[u].baseValue;
            U32 const nextState = symbolNext[symbol]++;
            tableDecode[u].nbBits = (BYTE) (tableLog - BIT_highbit32(nextState) );
            tableDecode[u].nextState = (U16) ( (nextState << tableDecode[u].nbBits) - tableSize);
            assert(nbAdditionalBits[symbol] < 255);
            tableDecode[u].nbAdditionalBits = (BYTE)nbAdditionalBits[symbol];
            tableDecode[u].baseValue = baseValue[symbol];
    }   }
}